

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O3

int prvTidytmbstrcmp(ctmbstr s1,ctmbstr s2)

{
  char cVar1;
  char cVar2;
  long lVar3;
  
  cVar1 = *s1;
  cVar2 = *s2;
  if (cVar1 == cVar2) {
    lVar3 = 1;
    do {
      if (cVar1 == '\0') {
        return 0;
      }
      cVar1 = s1[lVar3];
      cVar2 = s2[lVar3];
      lVar3 = lVar3 + 1;
    } while (cVar1 == cVar2);
  }
  return (uint)(cVar2 < cVar1) * 2 + -1;
}

Assistant:

int TY_(tmbstrcmp)( ctmbstr s1, ctmbstr s2 )
{
    int c;
    while ((c = *s1) == *s2)
    {
        if (c == '\0')
            return 0;

        ++s1;
        ++s2;
    }

    return (*s1 > *s2 ? 1 : -1);
}